

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O3

bool __thiscall QProcess::startDetached(QProcess *this,qint64 *pid)

{
  QProcessPrivate *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QProcessPrivate *)(this->super_QIODevice).super_QObject.d_ptr.d;
  if (this_00->processState == '\0') {
    if ((this_00->program).d.size != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        bVar1 = QProcessPrivate::startDetached(this_00,pid);
        return bVar1;
      }
      goto LAB_0041de00;
    }
    QMetaObject::tr(&local_30,&staticMetaObject,"No program defined",(char *)0x0,-1);
    QProcessPrivate::setErrorAndEmit(this_00,FailedToStart,&local_30);
    if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    startDetached();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return false;
  }
LAB_0041de00:
  __stack_chk_fail();
}

Assistant:

bool QProcess::startDetached(qint64 *pid)
{
    Q_D(QProcess);
    if (d->processState != NotRunning) {
        qWarning("QProcess::startDetached: Process is already running");
        return false;
    }
    if (d->program.isEmpty()) {
        d->setErrorAndEmit(QProcess::FailedToStart, tr("No program defined"));
        return false;
    }
    return d->startDetached(pid);
}